

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

XmlWriter * __thiscall Catch::XmlWriter::writeText(XmlWriter *this,string *text,XmlFormatting fmt)

{
  bool bVar1;
  ostream *os;
  XmlEncode local_50;
  
  if (text->_M_string_length != 0) {
    bVar1 = this->m_tagIsOpen;
    ensureTagClosed(this);
    if (((fmt & Indent) != None) && (bVar1 != false)) {
      std::operator<<((ostream *)this->m_os,(string *)&this->m_indent);
    }
    os = this->m_os;
    std::__cxx11::string::string((string *)&local_50,(string *)text);
    local_50.m_forWhat = ForTextNodes;
    XmlEncode::encodeTo(&local_50,os);
    std::__cxx11::string::~string((string *)&local_50);
    this->m_needsNewline = (bool)((byte)fmt >> 1 & 1);
  }
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeText( std::string const& text, XmlFormatting fmt) {
        if( !text.empty() ){
            bool tagWasOpen = m_tagIsOpen;
            ensureTagClosed();
            if (tagWasOpen && shouldIndent(fmt)) {
                m_os << m_indent;
            }
            m_os << XmlEncode( text );
            applyFormatting(fmt);
        }
        return *this;
    }